

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_utils.hpp
# Opt level: O1

string * PlatformUtilsGetSecureEnv_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *pcVar1;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  bool bVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (char *)secure_getenv(name);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv(name);
    if (pcVar1 == (char *)0x0) {
      bVar6 = false;
    }
    else {
      local_50 = local_40;
      sVar2 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar1,pcVar1 + sVar2);
      bVar6 = local_48 != 0;
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    if (bVar6) {
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"!!! WARNING !!! Environment variable ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_70);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_e0 = *plVar4;
        lStack_d8 = plVar3[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar4;
        local_f0 = (long *)*plVar3;
      }
      local_e8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_c0 = *plVar4;
        lStack_b8 = plVar3[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar4;
        local_d0 = (long *)*plVar3;
      }
      local_c8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_a0 = *plVar4;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar4;
        local_b0 = (long *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_90.field_2._M_allocated_capacity = *psVar5;
        local_90.field_2._8_8_ = plVar3[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar5;
        local_90._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_90._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      LogPlatformUtilsError(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(pcVar1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string PlatformUtilsGetSecureEnv(const char* name) {
    auto str = detail::ImplGetSecureEnv(name);
    if (str == nullptr) {
        str = detail::ImplGetEnv(name);
        if (str != nullptr && !std::string(str).empty()) {
            LogPlatformUtilsError(std::string("!!! WARNING !!! Environment variable ") + name +
                                  " is being ignored due to running with secure execution. The value '" + str +
                                  "' will NOT be used.");
        }
        return {};
    }
    return str;
}